

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall sf::Shader::setUniform(Shader *this,string *name,Texture *texture)

{
  size_t sVar1;
  int iVar2;
  iterator iVar3;
  _Base_ptr *pp_Var4;
  ostream *poVar5;
  ulong uVar6;
  TransientContextLock lock;
  int location;
  GLint maxUnits;
  TransientContextLock local_39;
  int local_38;
  GLint local_34;
  Lock local_30;
  
  if (this->m_shaderProgram == 0) {
    return;
  }
  GlResource::TransientContextLock::TransientContextLock(&local_39);
  local_38 = getUniformLocation(this,name);
  if (local_38 != -1) {
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_const_sf::Texture_*>,_std::_Select1st<std::pair<const_int,_const_sf::Texture_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
            ::find(&(this->m_textures)._M_t,&local_38);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->m_textures)._M_t._M_impl.super__Rb_tree_header)
    {
      sVar1 = (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      Lock::Lock(&local_30,(Mutex *)&(anonymous_namespace)::maxTextureUnitsMutex);
      if (((anonymous_namespace)::getMaxTextureUnits()::maxUnits == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits),
         iVar2 != 0)) {
        local_34 = 0;
        (*sf_glad_glGetIntegerv)(0x8b4d,&local_34);
        (anonymous_namespace)::getMaxTextureUnits()::maxUnits = local_34;
        __cxa_guard_release(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits);
      }
      uVar6 = (ulong)(anonymous_namespace)::getMaxTextureUnits()::maxUnits;
      Lock::~Lock(&local_30);
      if (uVar6 <= sVar1 + 1) {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,"Impossible to use texture \"");
        poVar5 = std::operator<<(poVar5,(string *)name);
        poVar5 = std::operator<<(poVar5,"\" for shader: all available texture units are used");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_001a7726;
      }
      pp_Var4 = (_Base_ptr *)
                std::
                map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                ::operator[](&this->m_textures,&local_38);
    }
    else {
      pp_Var4 = &iVar3._M_node[1]._M_parent;
    }
    *pp_Var4 = (_Base_ptr)texture;
  }
LAB_001a7726:
  GlResource::TransientContextLock::~TransientContextLock(&local_39);
  return;
}

Assistant:

void Shader::setUniform(const std::string& name, const Texture& texture)
{
    if (m_shaderProgram)
    {
        TransientContextLock lock;

        // Find the location of the variable in the shader
        int location = getUniformLocation(name);
        if (location != -1)
        {
            // Store the location -> texture mapping
            TextureTable::iterator it = m_textures.find(location);
            if (it == m_textures.end())
            {
                // New entry, make sure there are enough texture units
                if (m_textures.size() + 1 >= getMaxTextureUnits())
                {
                    err() << "Impossible to use texture \"" << name << "\" for shader: all available texture units are used" << std::endl;
                    return;
                }

                m_textures[location] = &texture;
            }
            else
            {
                // Location already used, just replace the texture
                it->second = &texture;
            }
        }
    }
}